

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

char * ssh_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  Conf *pCVar2;
  char *pcVar3;
  char *conn_err;
  char *loghost;
  Ssh *ssh;
  _Bool keepalive_local;
  char *pcStack_40;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  ssh._7_1_ = nodelay;
  ssh._6_1_ = keepalive;
  pcStack_40 = host;
  host_local = (char *)conf;
  conf_local = (Conf *)logctx;
  logctx_local = (LogContext *)backend_handle;
  backend_handle_local = (Backend **)seat;
  seat_local = (Seat *)vt;
  loghost = (char *)safemalloc(1,0x200,0);
  memset(loghost,0,0x200);
  pCVar2 = conf_copy((Conf *)host_local);
  *(Conf **)(loghost + 0x10) = pCVar2;
  ssh_cache_conf_values((Ssh *)loghost);
  loghost[0xcc] = -1;
  loghost[0xcd] = -1;
  loghost[0xce] = -1;
  loghost[0xcf] = -1;
  loghost[0x18c] = '\0';
  loghost[0x18d] = '\0';
  loghost[0x18e] = '\0';
  loghost[399] = '\0';
  loghost[400] = '\0';
  loghost[0x191] = '\0';
  loghost[0x192] = '\0';
  loghost[0x193] = '\0';
  bufchain_init((bufchain *)(loghost + 0xf0));
  bufchain_init((bufchain *)(loghost + 0x118));
  bufchain_init((bufchain *)(loghost + 0x140));
  *(code **)(loghost + 0x170) = ssh_bpp_output_raw_data_callback;
  *(char **)(loghost + 0x178) = loghost;
  iVar1 = conf_get_int(*(Conf **)(loghost + 0x10),0x7d);
  *(int *)(loghost + 0xe4) = iVar1;
  iVar1 = conf_get_int(*(Conf **)(loghost + 0x10),0x7e);
  *(int *)(loghost + 0xe8) = iVar1;
  *(Seat **)(loghost + 0x30) = seat_local;
  *(InteractorVtable **)(loghost + 0x40) = &Ssh_interactorvt;
  *(char **)(loghost + 0x38) = loghost + 0x40;
  logctx_local->lgfp = (FILE *)(loghost + 0x30);
  loghost[0x70] = *(int *)&seat_local[0x14].vt == 4;
  *(Backend ***)(loghost + 8) = backend_handle_local;
  *(ConnectionLayerVtable **)(loghost + 0x1d8) = &dummy_connlayer_vtable;
  *(Conf **)(loghost + 0x60) = conf_local;
  *(Conf **)(loghost + 0x1d0) = conf_local;
  ssh_hostport_setup(pcStack_40,port,*(Conf **)(loghost + 0x10),(char **)(loghost + 0xa8),
                     (int *)(loghost + 0xb0),&conn_err);
  pcVar3 = default_description((BackendVtable *)seat_local,*(char **)(loghost + 0xa8),
                               *(int *)(loghost + 0xb0));
  *(char **)(loghost + 0xc0) = pcVar3;
  random_ref();
  loghost[0x1f8] = '\x01';
  vt_local = (BackendVtable *)
             connect_to_host((Ssh *)loghost,pcStack_40,port,conn_err,realhost,(_Bool)(ssh._7_1_ & 1)
                             ,(_Bool)(ssh._6_1_ & 1));
  if (vt_local == (BackendVtable *)0x0) {
    vt_local = (BackendVtable *)0x0;
  }
  else {
    loghost[0x1f8] = '\0';
    random_unref();
  }
  return (char *)vt_local;
}

Assistant:

static char *ssh_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    Ssh *ssh;

    ssh = snew(Ssh);
    memset(ssh, 0, sizeof(Ssh));

    ssh->conf = conf_copy(conf);
    ssh_cache_conf_values(ssh);
    ssh->exitcode = -1;
    ssh->pls.kctx = SSH2_PKTCTX_NOKEX;
    ssh->pls.actx = SSH2_PKTCTX_NOAUTH;
    bufchain_init(&ssh->in_raw);
    bufchain_init(&ssh->out_raw);
    bufchain_init(&ssh->user_input);
    ssh->ic_out_raw.fn = ssh_bpp_output_raw_data_callback;
    ssh->ic_out_raw.ctx = ssh;

    ssh->term_width = conf_get_int(ssh->conf, CONF_width);
    ssh->term_height = conf_get_int(ssh->conf, CONF_height);

    ssh->backend.vt = vt;
    ssh->interactor.vt = &Ssh_interactorvt;
    ssh->backend.interactor = &ssh->interactor;
    *backend_handle = &ssh->backend;

    ssh->bare_connection = (vt->protocol == PROT_SSHCONN);

    ssh->seat = seat;
    ssh->cl_dummy.vt = &dummy_connlayer_vtable;
    ssh->cl_dummy.logctx = ssh->logctx = logctx;

    char *loghost;

    ssh_hostport_setup(host, port, ssh->conf,
                       &ssh->savedhost, &ssh->savedport, &loghost);
    ssh->description = default_description(vt, ssh->savedhost, ssh->savedport);

    random_ref(); /* do this now - may be needed by sharing setup code */
    ssh->need_random_unref = true;

    char *conn_err = connect_to_host(
        ssh, host, port, loghost, realhost, nodelay, keepalive);
    if (conn_err) {
        /* Call random_unref now instead of waiting until the caller
         * frees this useless Ssh object, in case the caller is
         * impatient and just exits without bothering, in which case
         * the random seed won't be re-saved. */
        ssh->need_random_unref = false;
        random_unref();
        return conn_err;
    }

    return NULL;
}